

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O2

void __thiscall
cmCommandArgumentsHelper::Parse
          (cmCommandArgumentsHelper *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unconsumedArgs)

{
  pointer ppcVar1;
  pointer pbVar2;
  cmCommandArgument *this_00;
  bool bVar3;
  pointer ppcVar4;
  cmCommandArgument *current;
  cmCommandArgument *pcVar5;
  string *it;
  pointer __x;
  vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *__range1;
  
  if (args != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    ppcVar1 = (this->Arguments).
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar4 = (this->Arguments).
                   super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1;
        ppcVar4 = ppcVar4 + 1) {
      pcVar5 = *ppcVar4;
      cmCommandArgument::ApplyOwnGroup(pcVar5);
      pcVar5->WasActive = false;
      pcVar5->CurrentIndex = 0;
      (*pcVar5->_vptr_cmCommandArgument[3])(pcVar5);
    }
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    current = (cmCommandArgument *)0x0;
    pcVar5 = (cmCommandArgument *)0x0;
    for (__x = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __x != pbVar2; __x = __x + 1) {
      ppcVar1 = (this->Arguments).
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar4 = (this->Arguments).
                     super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1;
          ppcVar4 = ppcVar4 + 1) {
        this_00 = *ppcVar4;
        bVar3 = cmCommandArgument::KeyMatches(this_00,__x);
        if ((bVar3) && (bVar3 = cmCommandArgument::MayFollow(this_00,current), bVar3)) {
          this_00->WasActive = true;
          this_00->CurrentIndex = 0;
          goto LAB_002b68a2;
        }
      }
      this_00 = pcVar5;
      if (pcVar5 == (cmCommandArgument *)0x0) {
        if (unconsumedArgs !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(unconsumedArgs,__x);
        }
        pcVar5 = (cmCommandArgument *)0x0;
      }
      else {
LAB_002b68a2:
        current = this_00;
        bVar3 = cmCommandArgument::Consume(current,__x);
        pcVar5 = (cmCommandArgument *)0x0;
        if (!bVar3) {
          pcVar5 = current;
        }
      }
    }
  }
  return;
}

Assistant:

void cmCommandArgumentsHelper::Parse(const std::vector<std::string>* args,
                                     std::vector<std::string>* unconsumedArgs)
{
  if (args == nullptr) {
    return;
  }

  for (cmCommandArgument* ca : this->Arguments) {
    ca->ApplyOwnGroup();
    ca->Reset();
  }

  cmCommandArgument* activeArgument = nullptr;
  const cmCommandArgument* previousArgument = nullptr;
  for (std::string const& it : *args) {
    for (cmCommandArgument* ca : this->Arguments) {
      if (ca->KeyMatches(it) && (ca->MayFollow(previousArgument))) {
        activeArgument = ca;
        activeArgument->Activate();
        break;
      }
    }

    if (activeArgument) {
      bool argDone = activeArgument->Consume(it);
      previousArgument = activeArgument;
      if (argDone) {
        activeArgument = nullptr;
      }
    } else {
      if (unconsumedArgs != nullptr) {
        unconsumedArgs->push_back(it);
      }
    }
  }
}